

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O3

QSize __thiscall DetailButton::sizeHint(DetailButton *this)

{
  QArrayData *pQVar1;
  undefined1 *puVar2;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  QStyle *pQVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QFontMetrics fm;
  undefined8 local_d0;
  QArrayData *local_c8;
  char16_t *pcStack_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  QSize QStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::ensurePolished((QWidget *)this);
  local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QStack_40 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)local_a8);
  (**(code **)(*(long *)&(this->super_QPushButton).super_QAbstractButton.super_QWidget + 0x1b8))
            (this,(QStyleOptionButton *)local_a8);
  local_b0 = &DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics
            ((QFontMetrics *)&local_b0,
             &((this->super_QPushButton).super_QAbstractButton.super_QWidget.data)->fnt);
  QMetaObject::tr((char *)&local_c8,(char *)&QMessageBox::staticMetaObject,0x6e7c54);
  pcVar4 = local_58;
  pQVar3 = pQStack_60;
  puVar2 = local_b8;
  pQVar1 = local_c8;
  local_c8 = pQStack_60;
  pQStack_60 = pQVar1;
  local_58 = pcStack_c0;
  pcStack_c0 = pcVar4;
  local_b8 = puStack_50;
  puStack_50 = puVar2;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  local_d0 = QFontMetrics::size((int)&local_b0,(QString *)0x800,(int)&pQStack_60,(int *)0x0);
  pQVar5 = QWidget::style((QWidget *)this);
  uVar6 = (**(code **)(*(long *)pQVar5 + 0xe8))(pQVar5,0,local_a8,&local_d0,this);
  QMetaObject::tr((char *)&local_c8,(char *)&QMessageBox::staticMetaObject,0x6e7c64);
  pcVar4 = local_58;
  pQVar3 = pQStack_60;
  puVar2 = local_b8;
  pQVar1 = local_c8;
  local_c8 = pQStack_60;
  pQStack_60 = pQVar1;
  local_58 = pcStack_c0;
  pcStack_c0 = pcVar4;
  local_b8 = puStack_50;
  puStack_50 = puVar2;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  local_d0 = QFontMetrics::size((int)(QFontMetrics *)&local_b0,(QString *)0x800,(int)&pQStack_60,
                                (int *)0x0);
  pQVar5 = QWidget::style((QWidget *)this);
  uVar7 = (**(code **)(*(long *)pQVar5 + 0xe8))(pQVar5,0,local_a8,&local_d0,this);
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_b0);
  QIcon::~QIcon(&local_48);
  if (pQStack_60 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_60,2,0x10);
    }
  }
  uVar8 = uVar7;
  if ((int)uVar7 < (int)uVar6) {
    uVar8 = uVar6;
  }
  if ((int)(uVar7 >> 0x20) < (int)(uVar6 >> 0x20)) {
    uVar7 = uVar6;
  }
  QStyleOption::~QStyleOption((QStyleOption *)local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QSize)(uVar8 & 0xffffffff | uVar7 & 0xffffffff00000000);
  }
  __stack_chk_fail();
}

Assistant:

QSize sizeHint() const override
    {
        ensurePolished();
        QStyleOptionButton opt;
        initStyleOption(&opt);
        const QFontMetrics fm = fontMetrics();
        opt.text = label(ShowLabel);
        QSize sz = fm.size(Qt::TextShowMnemonic, opt.text);
        QSize ret = style()->sizeFromContents(QStyle::CT_PushButton, &opt, sz, this);
        opt.text = label(HideLabel);
        sz = fm.size(Qt::TextShowMnemonic, opt.text);
        ret = ret.expandedTo(style()->sizeFromContents(QStyle::CT_PushButton, &opt, sz, this));
        return ret;
    }